

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void ImGui::ColorEditOptionsPopup(float *col,ImGuiColorEditFlags flags)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined8 uVar5;
  ImGuiContext *pIVar6;
  bool bVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  int iVar20;
  int local_8c;
  ImVec2 local_80;
  char buf [64];
  
  if ((flags & 0x700000U) != 0 && (flags & 0x1800000U) != 0) {
    return;
  }
  bVar7 = BeginPopup("context",0);
  pIVar6 = GImGui;
  if (!bVar7) {
    return;
  }
  uVar9 = GImGui->ColorEditOptions;
  if ((flags & 0x700000U) == 0) {
    bVar7 = RadioButton("RGB",(bool)((byte)(uVar9 >> 0x14) & 1));
    uVar8 = (uVar9 & 0xff8fffff) + 0x100000;
    if (!bVar7) {
      uVar8 = uVar9;
    }
    bVar7 = RadioButton("HSV",(bool)((byte)(uVar8 >> 0x15) & 1));
    uVar10 = uVar9 & 0xff8fffff | 0x200000;
    if (!bVar7) {
      uVar10 = uVar8;
    }
    bVar7 = RadioButton("Hex",(bool)((byte)(uVar10 >> 0x16) & 1));
    uVar9 = uVar10 & 0xff8fffff | 0x400000;
    if (!bVar7) {
      uVar9 = uVar10;
    }
    if ((flags & 0x1800000U) != 0) goto LAB_0028bbf0;
    Separator();
  }
  else if ((flags & 0x1800000U) != 0) goto LAB_0028bbf0;
  bVar7 = RadioButton("0..255",(bool)((byte)(uVar9 >> 0x17) & 1));
  uVar8 = (uVar9 & 0xfe7fffff) + 0x800000;
  if (!bVar7) {
    uVar8 = uVar9;
  }
  bVar7 = RadioButton("0.00..1.00",(bool)((byte)(uVar8 >> 0x18) & 1));
  uVar9 = uVar9 & 0xfe7fffff | 0x1000000;
  if (!bVar7) {
    uVar9 = uVar8;
  }
LAB_0028bbf0:
  Separator();
  buf._0_8_ = vmovlps_avx(SUB6416(ZEXT464(0xbf800000),0));
  bVar7 = Button("Copy as..",(ImVec2 *)buf);
  if (bVar7) {
    OpenPopup("Copy",0);
  }
  bVar7 = BeginPopup("Copy",0);
  if (bVar7) {
    fVar1 = *col;
    fVar2 = col[1];
    fVar3 = col[2];
    auVar15 = ZEXT816(0) << 0x40;
    auVar17 = SUB6416(ZEXT464(0x3f800000),0);
    auVar12 = vminss_avx(auVar17,ZEXT416((uint)fVar1));
    uVar5 = vcmpss_avx512f(ZEXT416((uint)fVar1),auVar15,1);
    auVar13 = vminss_avx(auVar17,ZEXT416((uint)fVar2));
    auVar14 = vminss_avx(auVar17,ZEXT416((uint)fVar3));
    auVar12._0_4_ = (uint)!(bool)((byte)uVar5 & 1) * auVar12._0_4_;
    uVar5 = vcmpss_avx512f(ZEXT416((uint)fVar2),auVar15,1);
    auVar18 = SUB6416(ZEXT464(0x437f0000),0);
    auVar19 = SUB6416(ZEXT464(0x3f000000),0);
    auVar12 = vfmadd213ss_fma(auVar12,auVar18,auVar19);
    auVar13._0_4_ = (uint)!(bool)((byte)uVar5 & 1) * auVar13._0_4_;
    uVar5 = vcmpss_avx512f(ZEXT416((uint)fVar3),auVar15,1);
    auVar13 = vfmadd213ss_fma(auVar13,auVar18,auVar19);
    auVar14._0_4_ = (uint)!(bool)((byte)uVar5 & 1) * auVar14._0_4_;
    auVar14 = vfmadd213ss_fma(auVar14,auVar18,auVar19);
    if ((flags & 2U) == 0) {
      fVar4 = col[3];
      auVar17 = vminss_avx(auVar17,ZEXT416((uint)fVar4));
      uVar5 = vcmpss_avx512f(ZEXT416((uint)fVar4),auVar15,1);
      auVar15._4_12_ = auVar17._4_12_;
      auVar15._0_4_ = (uint)!(bool)((byte)uVar5 & 1) * auVar17._0_4_;
      auVar15 = vfmadd213ss_fma(auVar18,auVar15,ZEXT416(0x3f000000));
      dVar16 = (double)fVar4;
      local_8c = (int)auVar15._0_4_;
    }
    else {
      dVar16 = 1.0;
      local_8c = 0xff;
    }
    uVar8 = (uint)auVar12._0_4_;
    uVar10 = (uint)auVar13._0_4_;
    uVar11 = (uint)auVar14._0_4_;
    ImFormatString(buf,0x40,"(%.3ff, %.3ff, %.3ff, %.3ff)",(double)fVar1,(double)fVar2,(double)fVar3
                   ,dVar16);
    local_80.x = 0.0;
    local_80.y = 0.0;
    bVar7 = Selectable(buf,false,0,&local_80);
    if (bVar7) {
      SetClipboardText(buf);
    }
    iVar20 = local_8c;
    ImFormatString(buf,0x40,"(%d,%d,%d,%d)",(ulong)uVar8,(ulong)uVar10,(ulong)uVar11,local_8c);
    local_80.x = 0.0;
    local_80.y = 0.0;
    bVar7 = Selectable(buf,false,0,&local_80);
    if (bVar7) {
      SetClipboardText(buf);
    }
    ImFormatString(buf,0x40,"#%02X%02X%02X",(ulong)uVar8,(ulong)uVar10,(ulong)uVar11,iVar20);
    local_80.x = 0.0;
    local_80.y = 0.0;
    bVar7 = Selectable(buf,false,0,&local_80);
    if (bVar7) {
      SetClipboardText(buf);
    }
    if ((flags & 2U) == 0) {
      ImFormatString(buf,0x40,"#%02X%02X%02X%02X",(ulong)uVar8,(ulong)uVar10,(ulong)uVar11,local_8c)
      ;
      local_80.x = 0.0;
      local_80.y = 0.0;
      bVar7 = Selectable(buf,false,0,&local_80);
      if (bVar7) {
        SetClipboardText(buf);
      }
    }
    EndPopup();
  }
  pIVar6->ColorEditOptions = uVar9;
  EndPopup();
  return;
}

Assistant:

void ImGui::ColorEditOptionsPopup(const float* col, ImGuiColorEditFlags flags)
{
    bool allow_opt_inputs = !(flags & ImGuiColorEditFlags_DisplayMask_);
    bool allow_opt_datatype = !(flags & ImGuiColorEditFlags_DataTypeMask_);
    if ((!allow_opt_inputs && !allow_opt_datatype) || !BeginPopup("context"))
        return;
    ImGuiContext& g = *GImGui;
    ImGuiColorEditFlags opts = g.ColorEditOptions;
    if (allow_opt_inputs)
    {
        if (RadioButton("RGB", (opts & ImGuiColorEditFlags_DisplayRGB) != 0)) opts = (opts & ~ImGuiColorEditFlags_DisplayMask_) | ImGuiColorEditFlags_DisplayRGB;
        if (RadioButton("HSV", (opts & ImGuiColorEditFlags_DisplayHSV) != 0)) opts = (opts & ~ImGuiColorEditFlags_DisplayMask_) | ImGuiColorEditFlags_DisplayHSV;
        if (RadioButton("Hex", (opts & ImGuiColorEditFlags_DisplayHex) != 0)) opts = (opts & ~ImGuiColorEditFlags_DisplayMask_) | ImGuiColorEditFlags_DisplayHex;
    }
    if (allow_opt_datatype)
    {
        if (allow_opt_inputs) Separator();
        if (RadioButton("0..255",     (opts & ImGuiColorEditFlags_Uint8) != 0)) opts = (opts & ~ImGuiColorEditFlags_DataTypeMask_) | ImGuiColorEditFlags_Uint8;
        if (RadioButton("0.00..1.00", (opts & ImGuiColorEditFlags_Float) != 0)) opts = (opts & ~ImGuiColorEditFlags_DataTypeMask_) | ImGuiColorEditFlags_Float;
    }

    if (allow_opt_inputs || allow_opt_datatype)
        Separator();
    if (Button("Copy as..", ImVec2(-1, 0)))
        OpenPopup("Copy");
    if (BeginPopup("Copy"))
    {
        int cr = IM_F32_TO_INT8_SAT(col[0]), cg = IM_F32_TO_INT8_SAT(col[1]), cb = IM_F32_TO_INT8_SAT(col[2]), ca = (flags & ImGuiColorEditFlags_NoAlpha) ? 255 : IM_F32_TO_INT8_SAT(col[3]);
        char buf[64];
        ImFormatString(buf, IM_ARRAYSIZE(buf), "(%.3ff, %.3ff, %.3ff, %.3ff)", col[0], col[1], col[2], (flags & ImGuiColorEditFlags_NoAlpha) ? 1.0f : col[3]);
        if (Selectable(buf))
            SetClipboardText(buf);
        ImFormatString(buf, IM_ARRAYSIZE(buf), "(%d,%d,%d,%d)", cr, cg, cb, ca);
        if (Selectable(buf))
            SetClipboardText(buf);
        ImFormatString(buf, IM_ARRAYSIZE(buf), "#%02X%02X%02X", cr, cg, cb);
        if (Selectable(buf))
            SetClipboardText(buf);
        if (!(flags & ImGuiColorEditFlags_NoAlpha))
        {
            ImFormatString(buf, IM_ARRAYSIZE(buf), "#%02X%02X%02X%02X", cr, cg, cb, ca);
            if (Selectable(buf))
                SetClipboardText(buf);
        }
        EndPopup();
    }

    g.ColorEditOptions = opts;
    EndPopup();
}